

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O0

StateSet * __thiscall RegexTree::firstpos(StateSet *__return_storage_ptr__,RegexTree *this)

{
  undefined1 local_50 [8];
  StateSet s;
  RegexTree *this_local;
  
  s._M_h._M_single_bucket = (__node_base_ptr)this;
  std::
  unordered_set<const_tree_node_*,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<const_tree_node_*>_>
  ::unordered_set((unordered_set<const_tree_node_*,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<const_tree_node_*>_>
                   *)local_50);
  firstpos(this->root,
           (unordered_set<const_tree_node_*,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<const_tree_node_*>_>
            *)local_50);
  std::
  unordered_set<const_tree_node_*,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<const_tree_node_*>_>
  ::unordered_set(__return_storage_ptr__,
                  (unordered_set<const_tree_node_*,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<const_tree_node_*>_>
                   *)local_50);
  std::
  unordered_set<const_tree_node_*,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<const_tree_node_*>_>
  ::~unordered_set((unordered_set<const_tree_node_*,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<const_tree_node_*>_>
                    *)local_50);
  return __return_storage_ptr__;
}

Assistant:

RegexTree::StateSet RegexTree::firstpos() const {
    StateSet s;
    firstpos(root, s);
    return std::move(s);
}